

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::anon_unknown_5::ValidateTargetConstraints
          (anon_unknown_5 *this,Message *options,DescriptorPool *pool,
          ErrorCollector *error_collector,string_view file_name,OptionTargetType target_type)

{
  bool bVar1;
  Descriptor *type;
  Message *pMVar2;
  MessageLite *this_00;
  LogMessage *pLVar3;
  anon_unknown_5 *this_01;
  OptionTargetType target_type_00;
  string_view sVar4;
  string_view file_name_00;
  LogMessage local_128;
  Voidify local_111;
  string_view local_110;
  byte local_f9;
  LogMessage local_f8;
  Voidify local_e1;
  undefined1 local_e0 [8];
  string serialized;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_b0;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_message;
  DynamicMessageFactory factory;
  Descriptor *descriptor;
  OptionTargetType target_type_local;
  ErrorCollector *error_collector_local;
  DescriptorPool *pool_local;
  Message *options_local;
  string_view file_name_local;
  
  target_type_00 = (OptionTargetType)file_name._M_str;
  sVar4 = protobuf::MessageLite::GetTypeName((MessageLite *)this);
  type = DescriptorPool::FindMessageTypeByName((DescriptorPool *)options,sVar4);
  if (type == (Descriptor *)0x0) {
    file_name_00._M_str._4_4_ = 0;
    file_name_00._0_12_ = file_name._0_12_;
    file_name_local._M_str._7_1_ =
         ValidateTargetConstraintsRecursive
                   (this,(Message *)pool,error_collector,file_name_00,target_type_00);
  }
  else {
    DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
    pMVar2 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&dynamic_message,type);
    pMVar2 = Message::New(pMVar2);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_b0,pMVar2);
    std::__cxx11::string::string((string *)local_e0);
    local_f9 = 0;
    bVar1 = protobuf::MessageLite::SerializeToString((MessageLite *)this,(string *)local_e0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x463,"options.SerializeToString(&serialized)");
      local_f9 = 1;
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_e1,pLVar3);
    }
    if ((local_f9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_f8);
    }
    this_00 = &std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&local_b0)->super_MessageLite;
    local_110 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
    bVar1 = protobuf::MessageLite::ParseFromString(this_00,local_110);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x464,"dynamic_message->ParseFromString(serialized)");
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_128);
    }
    this_01 = (anon_unknown_5 *)
              std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator*(&local_b0);
    sVar4._M_str._4_4_ = 0;
    sVar4._0_12_ = file_name._0_12_;
    file_name_local._M_str._7_1_ =
         ValidateTargetConstraintsRecursive
                   (this_01,(Message *)pool,error_collector,sVar4,target_type_00);
    std::__cxx11::string::~string((string *)local_e0);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_b0);
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
  }
  return file_name_local._M_str._7_1_;
}

Assistant:

bool ValidateTargetConstraints(const Message& options,
                               const DescriptorPool& pool,
                               DescriptorPool::ErrorCollector& error_collector,
                               absl::string_view file_name,
                               FieldOptions::OptionTargetType target_type) {
  const Descriptor* descriptor =
      pool.FindMessageTypeByName(options.GetTypeName());
  if (descriptor == nullptr) {
    // We were unable to find the options message in the descriptor pool. This
    // implies that the proto files we are working with do not depend on
    // descriptor.proto, in which case there are no custom options to worry
    // about. We can therefore skip the use of DynamicMessage.
    return ValidateTargetConstraintsRecursive(options, error_collector,
                                              file_name, target_type);
  } else {
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    ABSL_CHECK(options.SerializeToString(&serialized));
    ABSL_CHECK(dynamic_message->ParseFromString(serialized));
    return ValidateTargetConstraintsRecursive(*dynamic_message, error_collector,
                                              file_name, target_type);
  }
}